

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextodfwriter.cpp
# Opt level: O2

void __thiscall
QTextOdfWriter::tableCellStyleElement
          (QTextOdfWriter *this,QXmlStreamWriter *writer,int *formatIndex,
          QTextTableCellFormat *format,bool hasBorder,int tableId,QTextTableFormat tableFormatTmp)

{
  QArrayDataPointer<char16_t> *this_00;
  ulong uVar1;
  qreal qVar2;
  qreal qVar3;
  double pixels;
  char16_t *pcVar4;
  bool bVar5;
  BorderStyle BVar6;
  VerticalAlignment VVar7;
  storage_type *psVar8;
  char *pcVar9;
  undefined7 in_register_00000081;
  size_t sVar10;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar11;
  char16_t *pcVar12;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar13;
  long in_FS_OFFSET;
  QAnyStringView QVar14;
  QAnyStringView QVar15;
  QAnyStringView QVar16;
  QAnyStringView QVar17;
  QAnyStringView QVar18;
  QAnyStringView QVar19;
  QAnyStringView QVar20;
  QAnyStringView QVar21;
  QAnyStringView QVar22;
  QAnyStringView QVar23;
  QAnyStringView QVar24;
  QByteArrayView QVar25;
  QAnyStringView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QAnyStringView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QAnyStringView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QAnyStringView QVar35;
  QByteArrayView QVar36;
  QAnyStringView QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QAnyStringView QVar40;
  QByteArrayView QVar41;
  QByteArrayView QVar42;
  QAnyStringView QVar43;
  QByteArrayView QVar44;
  QAnyStringView QVar45;
  QByteArrayView QVar46;
  QAnyStringView QVar47;
  QByteArrayView QVar48;
  QAnyStringView QVar49;
  QByteArrayView QVar50;
  QByteArrayView QVar51;
  QByteArrayView QVar52;
  QAnyStringView QVar53;
  QAnyStringView QVar54;
  QAnyStringView QVar55;
  QAnyStringView QVar56;
  QAnyStringView QVar57;
  QAnyStringView QVar58;
  QAnyStringView QVar59;
  QAnyStringView QVar60;
  QAnyStringView QVar61;
  QAnyStringView QVar62;
  size_t sStack_2e0;
  char16_t *local_2c8;
  QArrayDataPointer<char16_t> local_228;
  undefined1 local_210 [32];
  QArrayDataPointer<char16_t> local_1f0;
  QArrayDataPointer<char16_t> local_1d8;
  QStringBuilder<QString,_QLatin1String> local_1b8;
  QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString> local_188;
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>,_QLatin1String>
  local_148;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>,_QLatin1String>,_QString>
  local_f8;
  QAnyStringView local_90;
  QArrayDataPointer<char16_t> local_80;
  char16_t *local_68;
  ulong uStack_60;
  char16_t *local_58;
  ulong uStack_50;
  char16_t *local_48;
  ulong uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar12 = (this->styleNS).d.ptr;
  uVar1 = (this->styleNS).d.size;
  psVar8 = (storage_type *)QByteArrayView::lengthHelperCharArray("style",6);
  QVar25.m_data = psVar8;
  QVar25.m_size = (qsizetype)&local_f8;
  QString::fromLatin1(QVar25);
  QVar14.m_size = (size_t)local_f8.a.a.a.a.d.ptr;
  QVar14.field_0.m_data = (void *)(uVar1 | 0x8000000000000000);
  QVar26.m_size = (size_t)pcVar12;
  QVar26.field_0.m_data_utf8 = (char *)writer;
  QXmlStreamWriter::writeStartElement(QVar26,QVar14);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
  pcVar12 = (this->styleNS).d.ptr;
  aVar11.m_data = (void *)((this->styleNS).d.size | 0x8000000000000000);
  if ((int)CONCAT71(in_register_00000081,hasBorder) == 0) {
    psVar8 = (storage_type *)QByteArrayView::lengthHelperCharArray("name",5);
    QVar30.m_data = psVar8;
    QVar30.m_size = (qsizetype)&local_f8;
    QString::fromLatin1(QVar30);
    pcVar4 = local_f8.a.a.a.a.d.ptr;
    aVar13.m_data = (void *)(local_f8.a.a.a.a.d.size | 0x8000000000000000);
    psVar8 = (storage_type *)QByteArrayView::lengthHelperCharArray("T%1",4);
    QVar31.m_data = psVar8;
    QVar31.m_size = (qsizetype)&local_188;
    QString::fromLatin1(QVar31);
    sVar10 = 0x20;
    QString::arg<int,_true>
              ((QString *)&local_148,(QString *)&local_188,*formatIndex,0,10,(QChar)0x20);
    local_58 = local_148.a.a.a.d.ptr;
    uStack_50 = local_148.a.a.a.d.size | 0x8000000000000000;
    QVar16.m_size = (size_t)pcVar4;
    QVar16.field_0.m_data = aVar11.m_data;
    QVar32.m_size = (size_t)pcVar12;
    QVar32.field_0.m_data_utf8 = (char *)writer;
    QVar55.m_size = sVar10;
    QVar55.field_0.m_data = aVar13.m_data;
    QXmlStreamWriter::writeAttribute(QVar32,QVar16,QVar55);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_148);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_188);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
  }
  else {
    psVar8 = (storage_type *)QByteArrayView::lengthHelperCharArray("name",5);
    QVar27.m_data = psVar8;
    QVar27.m_size = (qsizetype)&local_f8;
    QString::fromLatin1(QVar27);
    pcVar4 = local_f8.a.a.a.a.d.ptr;
    aVar13.m_data = (void *)(local_f8.a.a.a.a.d.size | 0x8000000000000000);
    psVar8 = (storage_type *)QByteArrayView::lengthHelperCharArray("TB%1.%2",8);
    QVar28.m_data = psVar8;
    QVar28.m_size = (qsizetype)&local_1b8;
    QString::fromLatin1(QVar28);
    QString::arg<int,_true>((QString *)&local_188,&local_1b8.a,tableId,0,10,(QChar)0x20);
    sVar10 = 0x20;
    QString::arg<int,_true>
              ((QString *)&local_148,(QString *)&local_188,*formatIndex,0,10,(QChar)0x20);
    local_48 = local_148.a.a.a.d.ptr;
    uStack_40 = local_148.a.a.a.d.size | 0x8000000000000000;
    QVar15.m_size = (size_t)pcVar4;
    QVar15.field_0.m_data = aVar11.m_data;
    QVar29.m_size = (size_t)pcVar12;
    QVar29.field_0.m_data_utf8 = (char *)writer;
    QVar54.m_size = sVar10;
    QVar54.field_0.m_data = aVar13.m_data;
    QXmlStreamWriter::writeAttribute(QVar29,QVar15,QVar54);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_148);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_188);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
  }
  pcVar12 = (this->styleNS).d.ptr;
  uVar1 = (this->styleNS).d.size;
  psVar8 = (storage_type *)QByteArrayView::lengthHelperCharArray("family",7);
  QVar33.m_data = psVar8;
  QVar33.m_size = (qsizetype)&local_f8;
  QString::fromLatin1(QVar33);
  pcVar4 = local_f8.a.a.a.a.d.ptr;
  aVar11.m_data = (void *)(local_f8.a.a.a.a.d.size | 0x8000000000000000);
  psVar8 = (storage_type *)QByteArrayView::lengthHelperCharArray("table-cell",0xb);
  QVar34.m_data = psVar8;
  QVar34.m_size = (qsizetype)&local_148;
  QString::fromLatin1(QVar34);
  local_68 = local_148.a.a.a.d.ptr;
  uStack_60 = local_148.a.a.a.d.size | 0x8000000000000000;
  QVar17.m_size = (size_t)pcVar4;
  QVar17.field_0.m_data = (void *)(uVar1 | 0x8000000000000000);
  QVar35.m_size = (size_t)pcVar12;
  QVar35.field_0.m_data_utf8 = (char *)writer;
  QVar56.m_size = sVar10;
  QVar56.field_0.m_data = aVar11.m_data;
  QXmlStreamWriter::writeAttribute(QVar35,QVar17,QVar56);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_148);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
  pcVar12 = (this->styleNS).d.ptr;
  uVar1 = (this->styleNS).d.size;
  psVar8 = (storage_type *)QByteArrayView::lengthHelperCharArray("table-cell-properties",0x16);
  QVar36.m_data = psVar8;
  QVar36.m_size = (qsizetype)&local_f8;
  QString::fromLatin1(QVar36);
  QVar18.m_size = (size_t)local_f8.a.a.a.a.d.ptr;
  QVar18.field_0.m_data = (void *)(uVar1 | 0x8000000000000000);
  QVar37.m_size = (size_t)pcVar12;
  QVar37.field_0.m_data_utf8 = (char *)writer;
  QXmlStreamWriter::writeEmptyElement(QVar37,QVar18);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
  if (!hasBorder) goto LAB_00527bb4;
  pcVar12 = (this->foNS).d.ptr;
  uVar1 = (this->foNS).d.size;
  psVar8 = (storage_type *)QByteArrayView::lengthHelperCharArray("border",7);
  QVar38.m_data = psVar8;
  QVar38.m_size = (qsizetype)&local_80;
  QString::fromLatin1(QVar38);
  qVar2 = QTextFrameFormat::border
                    ((QTextFrameFormat *)
                     tableFormatTmp.super_QTextFrameFormat.super_QTextFormat.d.d.ptr);
  pixelToPoint((QString *)&local_1d8,qVar2);
  local_1b8.a.d.size = local_1d8.size;
  local_1b8.a.d.ptr = local_1d8.ptr;
  local_1b8.a.d.d = local_1d8.d;
  local_1d8.d = (Data *)0x0;
  local_1d8.ptr = (char16_t *)0x0;
  local_1d8.size = 0;
  local_1b8.b.m_size = 1;
  local_1b8.b.m_data = " ";
  BVar6 = QTextFrameFormat::borderStyle
                    ((QTextFrameFormat *)
                     tableFormatTmp.super_QTextFrameFormat.super_QTextFormat.d.d.ptr);
  switch(BVar6) {
  case BorderStyle_None:
    pcVar9 = "none";
    sStack_2e0 = 5;
    goto LAB_00527a5b;
  case BorderStyle_Dotted:
  case BorderStyle_DotDotDash:
    pcVar9 = "dotted";
    break;
  case BorderStyle_Dashed:
  case BorderStyle_DotDash:
    pcVar9 = "dashed";
    break;
  case BorderStyle_Solid:
    pcVar9 = "solid";
    goto LAB_00527a4e;
  case BorderStyle_Double:
    pcVar9 = "double";
    break;
  case BorderStyle_Groove:
    pcVar9 = "groove";
    break;
  case BorderStyle_Ridge:
    pcVar9 = "ridge";
    goto LAB_00527a4e;
  case BorderStyle_Inset:
    pcVar9 = "inset";
LAB_00527a4e:
    sStack_2e0 = 6;
    goto LAB_00527a5b;
  case BorderStyle_Outset:
    pcVar9 = "outset";
    break;
  default:
    pcVar9 = "";
    sStack_2e0 = 1;
    goto LAB_00527a5b;
  }
  sStack_2e0 = 7;
LAB_00527a5b:
  psVar8 = (storage_type *)QByteArrayView::lengthHelperCharArray(pcVar9,sStack_2e0);
  QVar39.m_data = psVar8;
  QVar39.m_size = (qsizetype)&local_1f0;
  QString::fromLatin1(QVar39);
  QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>::QStringBuilder
            (&local_188,&local_1b8,(QString *)&local_1f0);
  QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>::QStringBuilder
            (&local_148.a,&local_188);
  local_148.b.m_size = 1;
  local_148.b.m_data = " ";
  QTextFrameFormat::borderBrush((QTextFrameFormat *)local_210);
  this_00 = (QArrayDataPointer<char16_t> *)(local_210 + 8);
  QColor::name((QString *)this_00,(QColor *)(local_210._0_8_ + 8),HexRgb);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>,_QLatin1String>,_QString>
  ::QStringBuilder(&local_f8,&local_148,(QString *)this_00);
  local_228.d = (Data *)0x0;
  local_228.ptr = (char16_t *)0x0;
  local_228.size = 0;
  QAnyStringView::
  QAnyStringView<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>,_QLatin1String>,_QString>,_true>
            (&local_90,&local_f8,
             (wrapped_t<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>,_QLatin1String>,_QString>,_QString>
              *)&local_228);
  QVar19.m_size = (size_t)local_80.ptr;
  QVar19.field_0.m_data = (void *)(uVar1 | 0x8000000000000000);
  QVar40.m_size = (size_t)pcVar12;
  QVar40.field_0.m_data_utf8 = (char *)writer;
  QVar57.m_size = sVar10;
  QVar57.field_0.m_data = (void *)(local_80.size | 0x8000000000000000);
  QXmlStreamWriter::writeAttribute(QVar40,QVar19,QVar57);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_228);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>,_QLatin1String>,_QString>
  ::~QStringBuilder(&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
  QBrush::~QBrush((QBrush *)local_210);
  QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>::~QStringBuilder(&local_148.a);
  QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>::~QStringBuilder(&local_188);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1f0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
LAB_00527bb4:
  qVar2 = QTextTableCellFormat::topPadding(format);
  qVar3 = QTextTableFormat::cellPadding
                    ((QTextTableFormat *)
                     tableFormatTmp.super_QTextFrameFormat.super_QTextFormat.d.d.ptr);
  pixels = qVar3 + qVar2;
  if (pixels <= 0.0) {
LAB_00527dab:
    qVar2 = QTextTableCellFormat::bottomPadding(format);
    qVar3 = QTextTableFormat::cellPadding
                      ((QTextTableFormat *)
                       tableFormatTmp.super_QTextFrameFormat.super_QTextFormat.d.d.ptr);
    if (0.0 < qVar3 + qVar2) {
      pcVar12 = (this->foNS).d.ptr;
      uVar1 = (this->foNS).d.size;
      psVar8 = (storage_type *)QByteArrayView::lengthHelperCharArray("padding-bottom",0xf);
      QVar44.m_data = psVar8;
      QVar44.m_size = (qsizetype)&local_f8;
      QString::fromLatin1(QVar44);
      pcVar4 = local_f8.a.a.a.a.d.ptr;
      aVar11.m_data = (void *)(local_f8.a.a.a.a.d.size | 0x8000000000000000);
      pixelToPoint((QString *)&local_148,qVar3 + qVar2);
      QVar21.m_size = (size_t)pcVar4;
      QVar21.field_0.m_data = (void *)(uVar1 | 0x8000000000000000);
      QVar45.m_size = (size_t)pcVar12;
      QVar45.field_0.m_data_utf8 = (char *)writer;
      QVar59.m_size = sVar10;
      QVar59.field_0.m_data = aVar11.m_data;
      QXmlStreamWriter::writeAttribute(QVar45,QVar21,QVar59);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_148);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
    }
    qVar2 = QTextTableCellFormat::leftPadding(format);
    qVar3 = QTextTableFormat::cellPadding
                      ((QTextTableFormat *)
                       tableFormatTmp.super_QTextFrameFormat.super_QTextFormat.d.d.ptr);
    if (0.0 < qVar3 + qVar2) {
      pcVar12 = (this->foNS).d.ptr;
      uVar1 = (this->foNS).d.size;
      psVar8 = (storage_type *)QByteArrayView::lengthHelperCharArray("padding-left",0xd);
      QVar46.m_data = psVar8;
      QVar46.m_size = (qsizetype)&local_f8;
      QString::fromLatin1(QVar46);
      pcVar4 = local_f8.a.a.a.a.d.ptr;
      aVar11.m_data = (void *)(local_f8.a.a.a.a.d.size | 0x8000000000000000);
      pixelToPoint((QString *)&local_148,qVar3 + qVar2);
      QVar22.m_size = (size_t)pcVar4;
      QVar22.field_0.m_data = (void *)(uVar1 | 0x8000000000000000);
      QVar47.m_size = (size_t)pcVar12;
      QVar47.field_0.m_data_utf8 = (char *)writer;
      QVar60.m_size = sVar10;
      QVar60.field_0.m_data = aVar11.m_data;
      QXmlStreamWriter::writeAttribute(QVar47,QVar22,QVar60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_148);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
    }
    qVar2 = QTextTableCellFormat::rightPadding(format);
    qVar3 = QTextTableFormat::cellPadding
                      ((QTextTableFormat *)
                       tableFormatTmp.super_QTextFrameFormat.super_QTextFormat.d.d.ptr);
    if (qVar3 + qVar2 <= 0.0) goto LAB_00528079;
    local_2c8 = (this->foNS).d.ptr;
    uVar1 = (this->foNS).d.size;
    psVar8 = (storage_type *)QByteArrayView::lengthHelperCharArray("padding-right",0xe);
    QVar48.m_data = psVar8;
    QVar48.m_size = (qsizetype)&local_f8;
    QString::fromLatin1(QVar48);
    pcVar12 = local_f8.a.a.a.a.d.ptr;
    pixelToPoint((QString *)&local_148,qVar3 + qVar2);
  }
  else {
    qVar3 = QTextTableCellFormat::bottomPadding(format);
    if ((qVar2 != qVar3) || (qVar3 = QTextTableCellFormat::leftPadding(format), qVar2 != qVar3)) {
LAB_00527ce3:
      pcVar12 = (this->foNS).d.ptr;
      uVar1 = (this->foNS).d.size;
      psVar8 = (storage_type *)QByteArrayView::lengthHelperCharArray("padding-top",0xc);
      QVar42.m_data = psVar8;
      QVar42.m_size = (qsizetype)&local_f8;
      QString::fromLatin1(QVar42);
      pcVar4 = local_f8.a.a.a.a.d.ptr;
      aVar11.m_data = (void *)(local_f8.a.a.a.a.d.size | 0x8000000000000000);
      pixelToPoint((QString *)&local_148,pixels);
      QVar20.m_size = (size_t)pcVar4;
      QVar20.field_0.m_data = (void *)(uVar1 | 0x8000000000000000);
      QVar43.m_size = (size_t)pcVar12;
      QVar43.field_0.m_data_utf8 = (char *)writer;
      QVar58.m_size = sVar10;
      QVar58.field_0.m_data = aVar11.m_data;
      QXmlStreamWriter::writeAttribute(QVar43,QVar20,QVar58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_148);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
      goto LAB_00527dab;
    }
    qVar3 = QTextTableCellFormat::rightPadding(format);
    if ((qVar2 != qVar3) || (NAN(qVar2) || NAN(qVar3))) goto LAB_00527ce3;
    local_2c8 = (this->foNS).d.ptr;
    uVar1 = (this->foNS).d.size;
    psVar8 = (storage_type *)QByteArrayView::lengthHelperCharArray("padding",8);
    QVar41.m_data = psVar8;
    QVar41.m_size = (qsizetype)&local_f8;
    QString::fromLatin1(QVar41);
    pcVar12 = local_f8.a.a.a.a.d.ptr;
    pixelToPoint((QString *)&local_148,pixels);
  }
  QVar23.m_size = (size_t)pcVar12;
  QVar23.field_0.m_data = (void *)(uVar1 | 0x8000000000000000);
  QVar49.m_size = (size_t)local_2c8;
  QVar49.field_0.m_data_utf8 = (char *)writer;
  QVar61.m_size = sVar10;
  QVar61.field_0.m_data = (void *)(local_f8.a.a.a.a.d.size | 0x8000000000000000);
  QXmlStreamWriter::writeAttribute(QVar49,QVar23,QVar61);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_148);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
LAB_00528079:
  bVar5 = QTextFormat::hasProperty((QTextFormat *)format,0x2021);
  if (bVar5) {
    local_f8.a.a.a.a.d.d = (Data *)0x0;
    local_f8.a.a.a.a.d.ptr = (char16_t *)0x0;
    local_f8.a.a.a.a.d.size = 0;
    VVar7 = QTextCharFormat::verticalAlignment(&format->super_QTextCharFormat);
    if (VVar7 == AlignBottom) {
      psVar8 = (storage_type *)QByteArrayView::lengthHelperCharArray("bottom",7);
      QVar50.m_data = psVar8;
      QVar50.m_size = (qsizetype)&local_148;
      QString::fromLatin1(QVar50);
      local_f8.a.a.a.a.d.d = local_148.a.a.a.d.d;
      local_f8.a.a.a.a.d.ptr = local_148.a.a.a.d.ptr;
    }
    else {
      if (VVar7 == AlignTop) {
        pcVar9 = "top";
        sStack_2e0 = 4;
      }
      else if (VVar7 == AlignMiddle) {
        pcVar9 = "middle";
        sStack_2e0 = 7;
      }
      else {
        pcVar9 = "automatic";
        sStack_2e0 = 10;
      }
      psVar8 = (storage_type *)QByteArrayView::lengthHelperCharArray(pcVar9,sStack_2e0);
      QVar51.m_data = psVar8;
      QVar51.m_size = (qsizetype)&local_148;
      QString::fromLatin1(QVar51);
      local_f8.a.a.a.a.d.d = local_148.a.a.a.d.d;
      local_f8.a.a.a.a.d.ptr = local_148.a.a.a.d.ptr;
    }
    local_148.a.a.a.d.d = (Data *)0x0;
    local_148.a.a.a.d.ptr = (char16_t *)0x0;
    local_148.a.a.a.d.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_148);
    pcVar12 = (this->styleNS).d.ptr;
    uVar1 = (this->styleNS).d.size;
    psVar8 = (storage_type *)QByteArrayView::lengthHelperCharArray("vertical-align",0xf);
    QVar52.m_data = psVar8;
    QVar52.m_size = (qsizetype)&local_148;
    QString::fromLatin1(QVar52);
    QVar24.m_size = (size_t)local_148.a.a.a.d.ptr;
    QVar24.field_0.m_data = (void *)(uVar1 | 0x8000000000000000);
    QVar53.m_size = (size_t)pcVar12;
    QVar53.field_0.m_data_utf8 = (char *)writer;
    QVar62.m_size = sVar10;
    QVar62.field_0.m_data = (void *)(local_148.a.a.a.d.size | 0x8000000000000000);
    QXmlStreamWriter::writeAttribute(QVar53,QVar24,QVar62);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_148);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextOdfWriter::tableCellStyleElement(QXmlStreamWriter &writer, const int &formatIndex,
                                           const QTextTableCellFormat &format,
                                           bool hasBorder, int tableId,
                                           const QTextTableFormat tableFormatTmp) const {
    writer.writeStartElement(styleNS, QString::fromLatin1("style"));
    if (hasBorder) {
        writer.writeAttribute(styleNS, QString::fromLatin1("name"),
                              QString::fromLatin1("TB%1.%2").arg(tableId).arg(formatIndex));
    } else {
        writer.writeAttribute(styleNS, QString::fromLatin1("name"), QString::fromLatin1("T%1").arg(formatIndex));
    }
    writer.writeAttribute(styleNS, QString::fromLatin1("family"), QString::fromLatin1("table-cell"));
    writer.writeEmptyElement(styleNS, QString::fromLatin1("table-cell-properties"));
    if (hasBorder) {
        writer.writeAttribute(foNS, QString::fromLatin1("border"),
                              pixelToPoint(tableFormatTmp.border()) + " "_L1
                              + borderStyleName(tableFormatTmp.borderStyle()) + " "_L1
                              + tableFormatTmp.borderBrush().color().name(QColor::HexRgb));
    }
    qreal topPadding = format.topPadding();
    qreal padding = topPadding + tableFormatTmp.cellPadding();
    if (padding > 0 && topPadding == format.bottomPadding()
        && topPadding == format.leftPadding() && topPadding == format.rightPadding()) {
        writer.writeAttribute(foNS, QString::fromLatin1("padding"), pixelToPoint(padding));
    }
    else {
        if (padding > 0)
            writer.writeAttribute(foNS, QString::fromLatin1("padding-top"), pixelToPoint(padding));
        padding = format.bottomPadding() + tableFormatTmp.cellPadding();
        if (padding > 0)
            writer.writeAttribute(foNS, QString::fromLatin1("padding-bottom"),
                                  pixelToPoint(padding));
        padding = format.leftPadding() + tableFormatTmp.cellPadding();
        if (padding > 0)
            writer.writeAttribute(foNS, QString::fromLatin1("padding-left"),
                                  pixelToPoint(padding));
        padding = format.rightPadding() + tableFormatTmp.cellPadding();
        if (padding > 0)
            writer.writeAttribute(foNS, QString::fromLatin1("padding-right"),
                                  pixelToPoint(padding));
    }

    if (format.hasProperty(QTextFormat::TextVerticalAlignment)) {
        QString pos;
        switch (format.verticalAlignment()) {  // TODO - review: doesn't handle all cases
        case QTextCharFormat::AlignMiddle:
            pos = QString::fromLatin1("middle"); break;
        case QTextCharFormat::AlignTop:
            pos = QString::fromLatin1("top"); break;
        case QTextCharFormat::AlignBottom:
            pos = QString::fromLatin1("bottom"); break;
        default:
            pos = QString::fromLatin1("automatic"); break;
        }
        writer.writeAttribute(styleNS, QString::fromLatin1("vertical-align"), pos);
    }

    // TODO
    // ODF just search for style-table-cell-properties-attlist)
    // QTextFormat::BackgroundImageUrl
    // format.background
    writer.writeEndElement(); // style
}